

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall
QMessageBox::QMessageBox
          (QMessageBox *this,QString *title,QString *text,Icon icon,int button0,int button1,
          int button2,QWidget *parent,WindowFlags f)

{
  long lVar1;
  QFlags<Qt::WindowType> QVar2;
  QMessageBoxPrivate *pQVar3;
  undefined4 in_ECX;
  QDialog *in_RDX;
  EVP_PKEY_CTX *in_RSI;
  QMessageBoxPrivate *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  undefined8 in_stack_00000010;
  QMessageBoxPrivate *d;
  WindowType in_stack_ffffffffffffff9c;
  Icon icon_00;
  int button2_00;
  QMessageBoxPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar3 = (QMessageBoxPrivate *)operator_new(0x3b0);
  QMessageBoxPrivate::QMessageBoxPrivate(pQVar3);
  icon_00 = in_stack_00000010._4_4_;
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)pQVar3,in_stack_ffffffffffffff9c);
  QFlags<Qt::WindowType>::operator|((QFlags<Qt::WindowType> *)pQVar3,in_stack_ffffffffffffff9c);
  QVar2 = QFlags<Qt::WindowType>::operator|
                    ((QFlags<Qt::WindowType> *)pQVar3,in_stack_ffffffffffffff9c);
  QDialog::QDialog(in_RDX,(QDialogPrivate *)CONCAT44(in_ECX,in_R8D),
                   (QWidget *)
                   CONCAT44(in_R9D,QVar2.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                                   super_QFlagsStorage<Qt::WindowType>.i),
                   (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)in_RSI >> 0x20,0));
  button2_00 = (int)((ulong)in_RDX >> 0x20);
  *(undefined ***)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate = &PTR_metaObject_00d254a8;
  *(undefined ***)&(in_RDI->super_QDialogPrivate).super_QWidgetPrivate.field_0x10 =
       &PTR__QMessageBox_00d25680;
  pQVar3 = d_func((QMessageBox *)0x7a7f99);
  QMessageBoxPrivate::init(pQVar3,in_RSI);
  setIcon((QMessageBox *)in_RDI,icon_00);
  QMessageBoxPrivate::addOldButtons(this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,button2_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMessageBox::QMessageBox(const QString &title, const QString &text, Icon icon,
                         int button0, int button1, int button2, QWidget *parent,
                         Qt::WindowFlags f)
    : QDialog(*new QMessageBoxPrivate, parent,
              f /*| Qt::MSWindowsFixedSizeDialogHint #### */| Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint)
{
    Q_D(QMessageBox);
    d->init(title, text);
    setIcon(icon);
    d->addOldButtons(button0, button1, button2);
}